

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

mip_level * __thiscall crnlib::mip_level::operator=(mip_level *this,mip_level *rhs)

{
  uint uVar1;
  component_flags cVar2;
  pixel_format pVar3;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar4;
  dxt_image *pdVar5;
  
  pdVar5 = (dxt_image *)rhs;
  clear(this);
  uVar1 = rhs->m_height;
  cVar2 = rhs->m_comp_flags;
  pVar3 = rhs->m_format;
  this->m_width = rhs->m_width;
  this->m_height = uVar1;
  this->m_comp_flags = cVar2;
  this->m_format = pVar3;
  this->m_orient_flags = rhs->m_orient_flags;
  if (rhs->m_pImage != (image_u8 *)0x0) {
    piVar4 = crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>,crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                       ((crnlib *)rhs->m_pImage,
                        (image<crnlib::color_quad<unsigned_char,_int>_> *)pdVar5);
    this->m_pImage = piVar4;
  }
  if (rhs->m_pDXTImage != (dxt_image *)0x0) {
    pdVar5 = crnlib_new<crnlib::dxt_image,crnlib::dxt_image>((crnlib *)rhs->m_pDXTImage,pdVar5);
    this->m_pDXTImage = pdVar5;
  }
  return this;
}

Assistant:

mip_level& mip_level::operator=(const mip_level& rhs) {
  clear();

  m_width = rhs.m_width;
  m_height = rhs.m_height;
  m_comp_flags = rhs.m_comp_flags;
  m_format = rhs.m_format;
  m_orient_flags = rhs.m_orient_flags;

  if (rhs.m_pImage)
    m_pImage = crnlib_new<image_u8>(*rhs.m_pImage);

  if (rhs.m_pDXTImage)
    m_pDXTImage = crnlib_new<dxt_image>(*rhs.m_pDXTImage);

  return *this;
}